

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.hpp
# Opt level: O3

critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
* __thiscall
diy::
concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
::operator[](concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
             *this,BlockID *x)

{
  mapped_type *pmVar1;
  unique_lock<tthread::fast_mutex> local_28;
  
  local_28._M_device = &this->mutex_;
  local_28._M_owns = false;
  std::unique_lock<tthread::fast_mutex>::lock(&local_28);
  local_28._M_owns = true;
  pmVar1 = std::
           map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
           ::operator[](&this->map_,x);
  if ((local_28._M_owns == true) && (local_28._M_device != (fast_mutex *)0x0)) {
    LOCK();
    (local_28._M_device)->mLock = 0;
    UNLOCK();
  }
  return pmVar1;
}

Assistant:

U&              operator[](const T& x)  { lock_guard<fast_mutex> l(mutex_); return map_[x]; }